

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_4,_2>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_4,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_> *dst)

{
  int row;
  long lVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_58;
  Matrix<float,_4,_2> local_38;
  
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_58);
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = 0;
    do {
      local_38.m_data.m_data[1].m_data[0] = 0.0;
      local_38.m_data.m_data[1].m_data[1] = 0.0;
      local_38.m_data.m_data[1].m_data[2] = 0.0;
      local_38.m_data.m_data[1].m_data[3] = 0.0;
      local_38.m_data.m_data[0].m_data[0] = 0.0;
      local_38.m_data.m_data[0].m_data[1] = 0.0;
      local_38.m_data.m_data[0].m_data[2] = 0.0;
      local_38.m_data.m_data[0].m_data[3] = 0.0;
      lVar1 = 0;
      do {
        fVar3 = 0.0;
        if (lVar1 == 0) {
          fVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2];
        }
        else {
          fVar4 = 0.0;
        }
        local_38.m_data.m_data[0].m_data[lVar1] = fVar4;
        if (lVar1 == 1) {
          fVar3 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2];
        }
        local_38.m_data.m_data[1].m_data[lVar1] = fVar3;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
      std::vector<tcu::Matrix<float,4,2>,std::allocator<tcu::Matrix<float,4,2>>>::
      emplace_back<tcu::Matrix<float,4,2>>
                ((vector<tcu::Matrix<float,4,2>,std::allocator<tcu::Matrix<float,4,2>>> *)dst,
                 &local_38);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}